

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.cc
# Opt level: O0

ShutdownData * google::protobuf::internal::ShutdownData::get(void)

{
  int iVar1;
  ShutdownData *pSVar2;
  ShutdownData *in_stack_fffffffffffffff0;
  
  if (get()::data == '\0') {
    iVar1 = __cxa_guard_acquire(&get()::data);
    if (iVar1 != 0) {
      pSVar2 = (ShutdownData *)operator_new(0x40);
      ShutdownData(in_stack_fffffffffffffff0);
      get::data = pSVar2;
      __cxa_guard_release(&get()::data);
    }
  }
  return get::data;
}

Assistant:

static ShutdownData* get() {
    static auto* data = new ShutdownData;
    return data;
  }